

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool Fossilize::Hashing::hash_pnext_chain
               (StateRecorder *recorder,Hasher *h,void *pNext,DynamicStateInfo *dynamic_state_info,
               VkGraphicsPipelineLibraryFlagsEXT state_flags)

{
  VkStructureType VVar1;
  VkStructureType VVar2;
  void *pvVar3;
  VkPipeline *ppVVar4;
  bool bVar5;
  VkPipelineLibraryCreateInfoKHR *info;
  ulong uVar6;
  VkStructureType *pVVar7;
  VkStructureType *pVVar8;
  ulong uVar9;
  byte bVar10;
  uint32_t uVar11;
  ulong uVar12;
  char cVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  VkPipeline pNext_00;
  uint32_t j;
  ulong uVar17;
  VkBaseInStructure *pin;
  undefined4 local_64;
  VkStructureType local_60;
  uint local_5c;
  StateRecorder *local_58;
  string local_50;
  
LAB_00131826:
  info = (VkPipelineLibraryCreateInfoKHR *)pnext_chain_skip_ignored_entries(pNext);
  if (info == (VkPipelineLibraryCreateInfoKHR *)0x0) {
LAB_00132392:
    return info == (VkPipelineLibraryCreateInfoKHR *)0x0;
  }
  VVar1 = info->sType;
  uVar9 = (ulong)VVar1;
  if ((uVar9 == 0x10) ||
     (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_MODULE_IDENTIFIER_CREATE_INFO_EXT))
  goto LAB_001322ff;
  uVar6 = h->h * 0x100000001b3 ^ uVar9;
  h->h = uVar6;
  if (uVar9 == 0x3b9b3762) {
    if ((dynamic_state_info == (DynamicStateInfo *)0x0) ||
       (dynamic_state_info->rasterization_stream == false)) {
LAB_001321a4:
      uVar9 = (ulong)*(uint *)&info->field_0x14;
    }
    else {
LAB_001321a0:
      uVar9 = 0;
    }
    uVar12 = (ulong)info->libraryCount;
LAB_001321aa:
    uVar6 = uVar6 * 0x100000001b3 ^ uVar12;
    goto LAB_001322f5;
  }
  if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_RENDERING_CREATE_INFO) {
    if ((state_flags & 8) != 0) {
      uVar6 = uVar6 * 0x100000001b3 ^ (ulong)*(uint *)&info->field_0x14;
      h->h = uVar6;
    }
    if ((state_flags & 0xe) != 0) {
      uVar6 = uVar6 * 0x100000001b3 ^ (ulong)info->libraryCount;
      h->h = uVar6;
    }
    if ((state_flags & 8) != 0) {
      uVar14 = *(uint *)&info->field_0x14;
      ppVVar4 = info->pLibraries;
      for (uVar9 = 0; uVar6 = uVar6 * 0x100000001b3, uVar14 != uVar9; uVar9 = uVar9 + 1) {
        uVar6 = uVar6 ^ *(uint *)((long)ppVVar4 + uVar9 * 4);
        h->h = uVar6;
      }
      VVar1 = info[1].sType;
      VVar2 = *(VkStructureType *)&info[1].field_0x4;
LAB_0013202f:
      uVar9 = (uVar6 ^ VVar1) * 0x100000001b3 ^ (ulong)VVar2;
LAB_001322fc:
      h->h = uVar9;
    }
  }
  else if (VVar1 == VK_STRUCTURE_TYPE_RENDER_PASS_MULTIVIEW_CREATE_INFO) {
    uVar14 = info->libraryCount;
    uVar9 = uVar6 * 0x100000001b3 ^ (ulong)uVar14;
    h->h = uVar9;
    ppVVar4 = info->pLibraries;
    for (uVar6 = 0; uVar14 != uVar6; uVar6 = uVar6 + 1) {
      uVar9 = uVar9 * 0x100000001b3 ^ (ulong)*(uint *)((long)ppVVar4 + uVar6 * 4);
      h->h = uVar9;
    }
    VVar1 = info[1].sType;
    uVar9 = uVar9 * 0x100000001b3 ^ (ulong)VVar1;
    h->h = uVar9;
    pvVar3 = info[1].pNext;
    for (uVar6 = 0; VVar1 != uVar6; uVar6 = uVar6 + 1) {
      uVar9 = uVar9 * 0x100000001b3 ^ (ulong)*(uint *)((long)pvVar3 + uVar6 * 4);
      h->h = uVar9;
    }
    uVar14 = info[1].libraryCount;
    uVar9 = uVar9 * 0x100000001b3 ^ (ulong)uVar14;
    h->h = uVar9;
    ppVVar4 = info[1].pLibraries;
    for (uVar6 = 0; uVar14 != uVar6; uVar6 = uVar6 + 1) {
      uVar9 = uVar9 * 0x100000001b3 ^ (ulong)*(uint *)((long)ppVVar4 + uVar6 * 4);
      h->h = uVar9;
    }
  }
  else {
    if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_ROBUSTNESS_CREATE_INFO) {
      uVar6 = (uVar6 * 0x100000001b3 ^ (ulong)*(uint *)((long)&info->pLibraries + 4)) *
              0x100000001b3 ^ (ulong)*(uint *)&info->pLibraries;
LAB_00131f64:
      uVar9 = (ulong)info->libraryCount;
      uVar12 = (ulong)*(uint *)&info->field_0x14;
      goto LAB_001321aa;
    }
    if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_DISCARD_RECTANGLE_STATE_CREATE_INFO_EXT) {
      uVar6 = uVar6 * 0x100000001b3 ^ (ulong)info->libraryCount;
      h->h = uVar6;
      uVar14 = *(uint *)&info->pLibraries;
      uVar9 = 0;
      if (dynamic_state_info->discard_rectangle_mode == false) {
        uVar9 = (ulong)*(uint *)&info->field_0x14;
      }
      uVar9 = (uVar9 ^ uVar6 * 0x100000001b3) * 0x100000001b3 ^ (ulong)uVar14;
      h->h = uVar9;
      if (dynamic_state_info->discard_rectangle == false) {
        lVar16 = *(long *)(info + 1);
        for (lVar15 = 0; (ulong)uVar14 << 4 != lVar15; lVar15 = lVar15 + 0x10) {
          uVar9 = (((uVar9 * 0x100000001b3 ^ (ulong)*(uint *)(lVar16 + lVar15)) * 0x100000001b3 ^
                   (ulong)*(uint *)(lVar16 + 4 + lVar15)) * 0x100000001b3 ^
                  (ulong)*(uint *)(lVar16 + 8 + lVar15)) * 0x100000001b3 ^
                  (ulong)*(uint *)(lVar16 + 0xc + lVar15);
          h->h = uVar9;
        }
      }
    }
    else {
      if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_CONSERVATIVE_STATE_CREATE_INFO_EXT) {
        uVar6 = uVar6 * 0x100000001b3 ^ (ulong)info->libraryCount;
        if (dynamic_state_info == (DynamicStateInfo *)0x0) {
          uVar6 = uVar6 * 0x100000001b3 ^ (ulong)*(uint *)&info->field_0x14;
        }
        else {
          if (dynamic_state_info->conservative_rasterization_mode == true) {
            uVar6 = uVar6 * 0x100000001b3;
          }
          else {
            uVar6 = uVar6 * 0x100000001b3 ^ (ulong)*(uint *)&info->field_0x14;
          }
          if (dynamic_state_info->extra_primitive_overestimation_size != false) {
LAB_001322ee:
            uVar9 = 0;
            goto LAB_001322f5;
          }
        }
LAB_001322f2:
        uVar9 = (ulong)*(uint *)&info->pLibraries;
        goto LAB_001322f5;
      }
      if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_DEPTH_CLIP_STATE_CREATE_INFO_EXT) {
        if ((dynamic_state_info != (DynamicStateInfo *)0x0) &&
           (dynamic_state_info->depth_clip_enable != false)) goto LAB_001321a0;
        goto LAB_001321a4;
      }
      if (VVar1 == VK_STRUCTURE_TYPE_RENDER_PASS_INPUT_ATTACHMENT_ASPECT_CREATE_INFO) {
        uVar14 = info->libraryCount;
        uVar9 = uVar6 * 0x100000001b3 ^ (ulong)uVar14;
        h->h = uVar9;
        ppVVar4 = info->pLibraries;
        for (lVar16 = 0; (ulong)uVar14 * 0xc - lVar16 != 0; lVar16 = lVar16 + 0xc) {
          uVar9 = ((uVar9 * 0x100000001b3 ^ (ulong)*(uint *)((long)ppVVar4 + lVar16)) *
                   0x100000001b3 ^ (ulong)*(uint *)((long)ppVVar4 + lVar16 + 4)) * 0x100000001b3 ^
                  (ulong)*(uint *)((long)ppVVar4 + lVar16 + 8);
          h->h = uVar9;
        }
      }
      else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLAMP_CONTROL_CREATE_INFO_EXT) {
        if ((dynamic_state_info == (DynamicStateInfo *)0x0) ||
           (dynamic_state_info->depth_clamp_range == false)) {
          uVar6 = uVar6 * 0x100000001b3 ^ (ulong)info->libraryCount;
          if (((ulong)info->libraryCount == 1) &&
             (ppVVar4 = info->pLibraries, ppVVar4 != (VkPipeline *)0x0)) {
            uVar12 = (ulong)*(uint *)ppVVar4;
            uVar9 = (ulong)*(uint *)((long)ppVVar4 + 4);
            goto LAB_001321aa;
          }
          goto LAB_00131ff5;
        }
      }
      else {
        if (VVar1 == VK_STRUCTURE_TYPE_SAMPLER_REDUCTION_MODE_CREATE_INFO) goto LAB_0013204e;
        if (VVar1 == VK_STRUCTURE_TYPE_SAMPLE_LOCATIONS_INFO_EXT) {
          uVar12 = (ulong)*(uint *)((long)&info->pLibraries + 4);
          uVar9 = (((uVar6 * 0x100000001b3 ^ uVar12) * 0x100000001b3 ^
                   (ulong)*(uint *)&info->field_0x14) * 0x100000001b3 ^
                  (ulong)*(uint *)&info->pLibraries) * 0x100000001b3 ^ (ulong)info->libraryCount;
          h->h = uVar9;
          lVar16 = *(long *)(info + 1);
          for (uVar6 = 0; uVar12 != uVar6; uVar6 = uVar6 + 1) {
            uVar9 = (uVar9 * 0x100000001b3 ^ (ulong)*(uint *)(lVar16 + uVar6 * 8)) * 0x100000001b3 ^
                    (ulong)*(uint *)(lVar16 + 4 + uVar6 * 8);
            h->h = uVar9;
          }
        }
        else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_SAMPLE_LOCATIONS_STATE_CREATE_INFO_EXT) {
          if (dynamic_state_info == (DynamicStateInfo *)0x0) {
            uVar11 = info->libraryCount;
            bVar10 = 1;
            cVar13 = '\0';
          }
          else {
            uVar11 = 0;
            if (dynamic_state_info->sample_locations_enable == false) {
              uVar11 = info->libraryCount;
            }
            cVar13 = dynamic_state_info->sample_locations;
            bVar10 = dynamic_state_info->sample_locations_enable ^ 1;
          }
          uVar9 = (ulong)uVar11 ^ uVar6 * 0x100000001b3;
          h->h = uVar9;
          if (((bVar10 & info->libraryCount == 0) == 0) && (cVar13 == '\0')) {
            if (*(long *)(info + 1) != 0) goto LAB_00132392;
            uVar14 = *(uint *)&info[1].field_0x14;
            uVar9 = (((uVar9 * 0x100000001b3 ^ (ulong)*(uint *)((long)&info[1].pNext + 4)) *
                      0x100000001b3 ^ (ulong)info[1].libraryCount) * 0x100000001b3 ^
                    (ulong)*(uint *)&info[1].pNext) * 0x100000001b3 ^ (ulong)uVar14;
            h->h = uVar9;
            ppVVar4 = info[1].pLibraries;
            for (uVar6 = 0; uVar14 != uVar6; uVar6 = uVar6 + 1) {
              uVar9 = (uVar9 * 0x100000001b3 ^ (ulong)*(uint *)(ppVVar4 + uVar6)) * 0x100000001b3 ^
                      (ulong)*(uint *)((long)ppVVar4 + uVar6 * 8 + 4);
              h->h = uVar9;
            }
          }
          else {
            uVar9 = uVar9 * 0x100000001b3;
LAB_001322aa:
            h->h = uVar9;
          }
        }
        else {
          if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_ADVANCED_STATE_CREATE_INFO_EXT) {
            if ((dynamic_state_info == (DynamicStateInfo *)0x0) ||
               (dynamic_state_info->color_blend_advanced != true)) {
              uVar6 = (uVar6 * 0x100000001b3 ^ (ulong)info->libraryCount) * 0x100000001b3 ^
                      (ulong)*(uint *)&info->field_0x14;
              goto LAB_001322f2;
            }
            goto LAB_00131ff5;
          }
          if (VVar1 == VK_STRUCTURE_TYPE_SAMPLER_YCBCR_CONVERSION_CREATE_INFO) {
            uVar6 = (((((((((uVar6 * 0x100000001b3 ^ (ulong)info->libraryCount) * 0x100000001b3 ^
                           (ulong)*(uint *)&info->field_0x14) * 0x100000001b3 ^
                          (ulong)*(uint *)&info->pLibraries) * 0x100000001b3 ^
                         (ulong)*(uint *)((long)&info->pLibraries + 4)) * 0x100000001b3 ^
                        (ulong)info[1].sType) * 0x100000001b3 ^ (ulong)*(uint *)&info[1].field_0x4)
                       * 0x100000001b3 ^ (ulong)*(uint *)&info[1].pNext) * 0x100000001b3 ^
                     (ulong)*(uint *)((long)&info[1].pNext + 4)) * 0x100000001b3 ^
                    (ulong)info[1].libraryCount) * 0x100000001b3 ^
                    (ulong)*(uint *)&info[1].field_0x14;
            uVar9 = (ulong)*(uint *)&info[1].pLibraries;
            goto LAB_001322f5;
          }
          if (VVar1 == VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_BINDING_FLAGS_CREATE_INFO) {
            uVar14 = info->libraryCount;
            uVar9 = uVar6 * 0x100000001b3 ^ (ulong)uVar14;
            h->h = uVar9;
            ppVVar4 = info->pLibraries;
            for (uVar6 = 0; uVar14 != uVar6; uVar6 = uVar6 + 1) {
              uVar9 = uVar9 * 0x100000001b3 ^ (ulong)*(uint *)((long)ppVVar4 + uVar6 * 4);
              h->h = uVar9;
            }
          }
          else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_DIVISOR_STATE_CREATE_INFO) {
            uVar14 = info->libraryCount;
            uVar9 = uVar6 * 0x100000001b3 ^ (ulong)uVar14;
            h->h = uVar9;
            ppVVar4 = info->pLibraries;
            for (uVar6 = 0; uVar14 != uVar6; uVar6 = uVar6 + 1) {
              uVar9 = (uVar9 * 0x100000001b3 ^ (ulong)*(uint *)(ppVVar4 + uVar6)) * 0x100000001b3 ^
                      (ulong)*(uint *)((long)ppVVar4 + uVar6 * 8 + 4);
              h->h = uVar9;
            }
          }
          else if (VVar1 == VK_STRUCTURE_TYPE_SUBPASS_DESCRIPTION_DEPTH_STENCIL_RESOLVE) {
            ppVVar4 = info->pLibraries;
            if (ppVVar4 == (VkPipeline *)0x0) goto LAB_00131ff5;
            h->h = ((((uVar6 * 0x100000001b3 ^ (ulong)info->libraryCount) * 0x100000001b3 ^
                     (ulong)*(uint *)&info->field_0x14) * 0x100000001b3 ^
                    (ulong)*(uint *)(ppVVar4 + 2)) * 0x100000001b3 ^
                   (ulong)*(uint *)((long)ppVVar4 + 0x14)) * 0x100000001b3 ^
                   (ulong)*(uint *)(ppVVar4 + 3);
            local_64 = 0x3b9e7769;
            pNext_00 = ppVVar4[1];
            local_5c = state_flags;
            local_58 = recorder;
            while (pVVar7 = (VkStructureType *)pnext_chain_skip_ignored_entries(pNext_00),
                  pVVar7 != (VkStructureType *)0x0) {
              local_60 = *pVVar7;
              pVVar8 = std::
                       __find_if<VkStructureType_const*,__gnu_cxx::__ops::_Iter_equals_val<VkStructureType_const>>
                                 (&local_64,&local_60,&local_60);
              if (pVVar8 == &local_60) goto LAB_00132392;
              pNext_00 = *(VkPipeline *)(pVVar7 + 2);
            }
            bVar5 = hash_pnext_chain(local_58,h,info->pLibraries[1],(DynamicStateInfo *)0x0,0);
            recorder = local_58;
            state_flags = local_5c;
            if (!bVar5) goto LAB_00132392;
          }
          else {
            if (VVar1 == VK_STRUCTURE_TYPE_RENDER_PASS_FRAGMENT_DENSITY_MAP_CREATE_INFO_EXT) {
LAB_00131a55:
              VVar1 = info->libraryCount;
              VVar2 = *(VkStructureType *)&info->field_0x14;
LAB_0013202b:
              uVar6 = uVar6 * 0x100000001b3;
              goto LAB_0013202f;
            }
            if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_REQUIRED_SUBGROUP_SIZE_CREATE_INFO)
            goto LAB_0013204e;
            if (VVar1 == VK_STRUCTURE_TYPE_FRAGMENT_SHADING_RATE_ATTACHMENT_INFO_KHR) {
              lVar16 = *(long *)&info->libraryCount;
              if (lVar16 == 0) {
LAB_00131ff5:
                uVar9 = uVar6 * 0x100000001b3;
                goto LAB_001322fc;
              }
              h->h = ((((uVar6 * 0x100000001b3 ^ (ulong)*(uint *)(lVar16 + 0x10)) * 0x100000001b3 ^
                       (ulong)*(uint *)(lVar16 + 0x14)) * 0x100000001b3 ^
                      (ulong)*(uint *)(lVar16 + 0x18)) * 0x100000001b3 ^
                     (ulong)*(uint *)&info->pLibraries) * 0x100000001b3 ^
                     (ulong)*(uint *)((long)&info->pLibraries + 4);
              if (*(long *)(lVar16 + 8) != 0) goto LAB_00132392;
            }
            else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_FRAGMENT_SHADING_RATE_STATE_CREATE_INFO_KHR
                    ) {
              if ((dynamic_state_info != (DynamicStateInfo *)0x0) &&
                 (dynamic_state_info->fragment_shading_rate == false)) {
LAB_00131f9c:
                uVar6 = ((uVar6 * 0x100000001b3 ^ (ulong)info->libraryCount) * 0x100000001b3 ^
                        (ulong)*(uint *)&info->field_0x14) * 0x100000001b3 ^
                        (ulong)*(uint *)&info->pLibraries;
                uVar9 = (ulong)*(uint *)((long)&info->pLibraries + 4);
                goto LAB_001322f5;
              }
            }
            else {
              if (VVar1 != VK_STRUCTURE_TYPE_RENDERING_ATTACHMENT_LOCATION_INFO) {
                if (VVar1 == VK_STRUCTURE_TYPE_RENDERING_INPUT_ATTACHMENT_INDEX_INFO) {
                  uVar14 = info->libraryCount;
                  uVar9 = uVar6 * 0x100000001b3 ^ (ulong)uVar14;
                  ppVVar4 = info->pLibraries;
                  if (ppVVar4 == (VkPipeline *)0x0) {
                    uVar9 = uVar9 * 0x100000001b3;
                  }
                  else {
                    for (uVar6 = 0; uVar14 != uVar6; uVar6 = uVar6 + 1) {
                      uVar9 = uVar9 * 0x100000001b3 ^ (ulong)*(uint *)((long)ppVVar4 + uVar6 * 4);
                      h->h = uVar9;
                    }
                  }
                  if (*(uint **)(info + 1) == (uint *)0x0) {
                    uVar6 = uVar9 * 0x100000001b3 ^ 0xffff;
                  }
                  else {
                    uVar6 = uVar9 * 0x100000001b3 ^ (ulong)**(uint **)(info + 1);
                  }
                  if ((uint *)info[1].pNext == (uint *)0x0) {
                    uVar9 = uVar6 * 0x100000001b3 ^ 0xffff;
                    goto LAB_001322fc;
                  }
                  uVar9 = (ulong)*info[1].pNext;
                }
                else {
                  if (VVar1 != VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_STENCIL_LAYOUT) {
                    if (VVar1 == VK_STRUCTURE_TYPE_ATTACHMENT_DESCRIPTION_STENCIL_LAYOUT)
                    goto LAB_00131a55;
                    if (VVar1 == 
                        VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_PROVOKING_VERTEX_STATE_CREATE_INFO_EXT
                       ) {
                      if (dynamic_state_info != (DynamicStateInfo *)0x0) {
                        cVar13 = dynamic_state_info->provoking_vertex_mode;
                        goto joined_r0x00132048;
                      }
                    }
                    else {
                      if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_LINE_STATE_CREATE_INFO)
                      {
                        if (dynamic_state_info == (DynamicStateInfo *)0x0) {
                          uVar9 = (ulong)info->libraryCount;
                          uVar14 = *(uint *)&info->field_0x14;
                          bVar10 = uVar14 != 0;
                        }
                        else {
                          uVar14 = *(uint *)&info->field_0x14;
                          if (dynamic_state_info->line_rasterization_mode == false) {
                            uVar9 = (ulong)info->libraryCount;
                          }
                          else {
                            uVar9 = 0;
                          }
                          bVar10 = (dynamic_state_info->line_stipple ^ 1U) &
                                   (uVar14 != 0 | dynamic_state_info->line_stipple_enable);
                          if (dynamic_state_info->line_stipple_enable != false) {
                            uVar14 = 0;
                          }
                        }
                        uVar9 = (uVar6 * 0x100000001b3 ^ uVar9) * 0x100000001b3 ^ (ulong)uVar14;
                        h->h = uVar9;
                        uVar6 = (ulong)*(uint *)&info->pLibraries;
                        if (bVar10 == 0) {
                          uVar6 = 0;
                        }
                        uVar6 = uVar6 ^ uVar9 * 0x100000001b3;
                        h->h = uVar6;
                        uVar9 = (ulong)*(ushort *)((long)&info->pLibraries + 4);
                        if (bVar10 == 0) {
                          uVar9 = 0;
                        }
                        uVar9 = uVar6 * 0x100000001b3 ^ uVar9;
LAB_00132361:
                        h->h = uVar9;
                        goto LAB_001322ff;
                      }
                      if (VVar1 == VK_STRUCTURE_TYPE_DEPTH_BIAS_REPRESENTATION_INFO_EXT) {
                        if ((dynamic_state_info == (DynamicStateInfo *)0x0) ||
                           (dynamic_state_info->depth_bias == false)) goto LAB_00131f64;
                        goto LAB_00131ff5;
                      }
                      if (VVar1 == VK_STRUCTURE_TYPE_SAMPLER_CUSTOM_BORDER_COLOR_CREATE_INFO_EXT) {
                        uVar9 = uVar6 * 0x100000001b3 ^ (ulong)info->libraryCount;
                        h->h = uVar9;
                        uVar9 = uVar9 * 0x100000001b3 ^ (ulong)*(uint *)&info->field_0x14;
                        h->h = uVar9;
                        uVar6 = uVar9 * 0x100000001b3 ^ (ulong)*(uint *)&info->pLibraries;
                        h->h = uVar6;
                        VVar1 = *(VkStructureType *)((long)&info->pLibraries + 4);
                        VVar2 = info[1].sType;
                        goto LAB_0013202b;
                      }
                      if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_LIBRARY_CREATE_INFO_KHR) {
                        bVar5 = hash_pnext_struct(recorder,h,info);
                        if (bVar5) goto LAB_001322ff;
                        goto LAB_00132392;
                      }
                      if (VVar1 == VK_STRUCTURE_TYPE_MEMORY_BARRIER_2) {
                        uVar9 = ((ulong)info[1].pNext & 0xffffffff ^
                                ((*(ulong *)(info + 1) & 0xffffffff ^
                                 (((ulong)info->pLibraries & 0xffffffff ^
                                  ((*(ulong *)&info->libraryCount & 0xffffffff ^
                                   uVar6 * 0x100000001b3) * 0x100000001b3 ^
                                  *(ulong *)&info->libraryCount >> 0x20) * 0x100000001b3) *
                                  0x100000001b3 ^ (ulong)info->pLibraries >> 0x20) * 0x100000001b3)
                                 * 0x100000001b3 ^ *(ulong *)(info + 1) >> 0x20) * 0x100000001b3) *
                                0x100000001b3 ^ (ulong)info[1].pNext >> 0x20;
                        goto LAB_001322aa;
                      }
                      if (VVar1 == VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_LIBRARY_CREATE_INFO_EXT)
                      goto LAB_0013204e;
                      if (VVar1 == VK_STRUCTURE_TYPE_MUTABLE_DESCRIPTOR_TYPE_CREATE_INFO_EXT) {
                        uVar14 = info->libraryCount;
                        uVar9 = uVar6 * 0x100000001b3 ^ (ulong)uVar14;
                        h->h = uVar9;
                        ppVVar4 = info->pLibraries;
                        for (uVar6 = 0; uVar6 != uVar14; uVar6 = uVar6 + 1) {
                          uVar12 = (ulong)*(uint *)(ppVVar4 + uVar6 * 2);
                          uVar9 = uVar9 * 0x100000001b3 ^ uVar12;
                          h->h = uVar9;
                          for (uVar17 = 0; uVar12 != uVar17; uVar17 = uVar17 + 1) {
                            uVar9 = uVar9 * 0x100000001b3 ^
                                    (ulong)*(uint *)(ppVVar4[uVar6 * 2 + 1] + uVar17 * 4);
                            h->h = uVar9;
                          }
                        }
                        goto LAB_001322ff;
                      }
                      if (VVar1 == 
                          VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLIP_CONTROL_CREATE_INFO_EXT) {
                        if (dynamic_state_info != (DynamicStateInfo *)0x0) {
                          cVar13 = dynamic_state_info->depth_clip_negative_one_to_one;
joined_r0x00132048:
                          if (cVar13 != '\0') goto LAB_001322ee;
                        }
                      }
                      else {
                        if (VVar1 == 
                            VK_STRUCTURE_TYPE_MULTISAMPLED_RENDER_TO_SINGLE_SAMPLED_INFO_EXT)
                        goto LAB_00131a55;
                        if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_COLOR_WRITE_CREATE_INFO_EXT) {
                          uVar14 = info->libraryCount;
                          uVar9 = uVar6 * 0x100000001b3 ^ (ulong)uVar14;
                          h->h = uVar9;
                          if ((dynamic_state_info != (DynamicStateInfo *)0x0) &&
                             (dynamic_state_info->color_write_enable == false)) {
                            ppVVar4 = info->pLibraries;
                            for (uVar6 = 0; uVar14 != uVar6; uVar6 = uVar6 + 1) {
                              uVar9 = uVar9 * 0x100000001b3 ^
                                      (ulong)*(uint *)((long)ppVVar4 + uVar6 * 4);
                              h->h = uVar9;
                            }
                          }
                          goto LAB_001322ff;
                        }
                        if (VVar1 == 
                            VK_STRUCTURE_TYPE_SAMPLER_BORDER_COLOR_COMPONENT_MAPPING_CREATE_INFO_EXT
                           ) {
                          uVar6 = uVar6 * 0x100000001b3 ^ (ulong)info[1].sType;
                          goto LAB_00131f9c;
                        }
                        if (VVar1 != VK_STRUCTURE_TYPE_RENDER_PASS_CREATION_CONTROL_EXT) {
                          if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO) {
                            uVar9 = ((ulong)((uint)*(ulong *)&info->libraryCount & 0x7ffffc3f) ^
                                    uVar6 * 0x100000001b3) * 0x100000001b3 ^
                                    *(ulong *)&info->libraryCount >> 0x20;
                            goto LAB_00132361;
                          }
                          if (VVar1 != 
                              VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_DOMAIN_ORIGIN_STATE_CREATE_INFO
                             ) {
                            std::__cxx11::string::string
                                      ((string *)&local_50,"Unsupported pNext found, cannot hash.",
                                       (allocator *)&local_60);
                            log_error_pnext_chain(&local_50,info);
                            std::__cxx11::string::_M_dispose();
                            goto LAB_00132392;
                          }
                          if (dynamic_state_info != (DynamicStateInfo *)0x0) {
                            cVar13 = dynamic_state_info->tessellation_domain_origin;
                            goto joined_r0x00132048;
                          }
                        }
                      }
                    }
                  }
LAB_0013204e:
                  uVar9 = (ulong)info->libraryCount;
                }
LAB_001322f5:
                uVar9 = uVar6 * 0x100000001b3 ^ uVar9;
                goto LAB_001322fc;
              }
              uVar14 = info->libraryCount;
              uVar6 = uVar6 * 0x100000001b3 ^ (ulong)uVar14;
              h->h = uVar6;
              ppVVar4 = info->pLibraries;
              if (ppVVar4 == (VkPipeline *)0x0) goto LAB_00131ff5;
              for (uVar9 = 0; uVar14 != uVar9; uVar9 = uVar9 + 1) {
                uVar6 = uVar6 * 0x100000001b3 ^ (ulong)*(uint *)((long)ppVVar4 + uVar9 * 4);
                h->h = uVar6;
              }
            }
          }
        }
      }
    }
  }
LAB_001322ff:
  pNext = info->pNext;
  goto LAB_00131826;
}

Assistant:

static bool hash_pnext_chain(const StateRecorder *recorder, Hasher &h, const void *pNext,
                             const DynamicStateInfo *dynamic_state_info,
                             VkGraphicsPipelineLibraryFlagsEXT state_flags)
{
	while ((pNext = pnext_chain_skip_ignored_entries(pNext)) != nullptr)
	{
		auto *pin = static_cast<const VkBaseInStructure *>(pNext);

		if (pnext_chain_stype_is_hash_invariant(pin->sType))
		{
			pNext = pin->pNext;
			continue;
		}

		h.s32(pin->sType);

		switch (pin->sType)
		{
		case VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_DOMAIN_ORIGIN_STATE_CREATE_INFO:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineTessellationDomainOriginStateCreateInfo *>(pNext), dynamic_state_info);
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_DIVISOR_STATE_CREATE_INFO_KHR:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineVertexInputDivisorStateCreateInfoKHR *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_DEPTH_CLIP_STATE_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineRasterizationDepthClipStateCreateInfoEXT *>(pNext), dynamic_state_info);
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_STREAM_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineRasterizationStateStreamCreateInfoEXT *>(pNext), dynamic_state_info);
			break;

		case VK_STRUCTURE_TYPE_RENDER_PASS_MULTIVIEW_CREATE_INFO:
			hash_pnext_struct(recorder, h, *static_cast<const VkRenderPassMultiviewCreateInfo *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_BINDING_FLAGS_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkDescriptorSetLayoutBindingFlagsCreateInfoEXT *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_ADVANCED_STATE_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineColorBlendAdvancedStateCreateInfoEXT *>(pNext), dynamic_state_info);
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_CONSERVATIVE_STATE_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineRasterizationConservativeStateCreateInfoEXT *>(pNext), dynamic_state_info);
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_LINE_STATE_CREATE_INFO_KHR:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineRasterizationLineStateCreateInfoKHR *>(pNext), dynamic_state_info);
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_REQUIRED_SUBGROUP_SIZE_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineShaderStageRequiredSubgroupSizeCreateInfoEXT *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_MUTABLE_DESCRIPTOR_TYPE_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkMutableDescriptorTypeCreateInfoEXT *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_ATTACHMENT_DESCRIPTION_STENCIL_LAYOUT_KHR:
			hash_pnext_struct(recorder, h, *static_cast<const VkAttachmentDescriptionStencilLayoutKHR *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_FRAGMENT_SHADING_RATE_ATTACHMENT_INFO_KHR:
			if (!hash_pnext_struct(recorder, h, *static_cast<const VkFragmentShadingRateAttachmentInfoKHR *>(pNext)))
				return false;
			break;

		case VK_STRUCTURE_TYPE_SUBPASS_DESCRIPTION_DEPTH_STENCIL_RESOLVE:
			if (!hash_pnext_struct(recorder, h, *static_cast<const VkSubpassDescriptionDepthStencilResolve *>(pNext)))
				return false;
			break;

		case VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_STENCIL_LAYOUT_KHR:
			hash_pnext_struct(recorder, h, *static_cast<const VkAttachmentReferenceStencilLayoutKHR *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_RENDERING_CREATE_INFO_KHR:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineRenderingCreateInfoKHR *>(pNext), state_flags);
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_COLOR_WRITE_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineColorWriteCreateInfoEXT *>(pNext), dynamic_state_info);
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_SAMPLE_LOCATIONS_STATE_CREATE_INFO_EXT:
			if (!hash_pnext_struct(recorder, h, *static_cast<const VkPipelineSampleLocationsStateCreateInfoEXT *>(pNext), dynamic_state_info))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_PROVOKING_VERTEX_STATE_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineRasterizationProvokingVertexStateCreateInfoEXT *>(pNext), dynamic_state_info);
			break;

		case VK_STRUCTURE_TYPE_SAMPLER_CUSTOM_BORDER_COLOR_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkSamplerCustomBorderColorCreateInfoEXT *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_SAMPLER_REDUCTION_MODE_CREATE_INFO:
			hash_pnext_struct(recorder, h, *static_cast<const VkSamplerReductionModeCreateInfo *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_RENDER_PASS_INPUT_ATTACHMENT_ASPECT_CREATE_INFO:
			hash_pnext_struct(recorder, h, *static_cast<const VkRenderPassInputAttachmentAspectCreateInfo *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_DISCARD_RECTANGLE_STATE_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineDiscardRectangleStateCreateInfoEXT *>(pNext), dynamic_state_info);
			break;

		case VK_STRUCTURE_TYPE_MEMORY_BARRIER_2_KHR:
			hash_pnext_struct(recorder, h, *static_cast<const VkMemoryBarrier2KHR *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_FRAGMENT_SHADING_RATE_STATE_CREATE_INFO_KHR:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineFragmentShadingRateStateCreateInfoKHR *>(pNext), dynamic_state_info);
			break;

		case VK_STRUCTURE_TYPE_SAMPLER_YCBCR_CONVERSION_CREATE_INFO:
			hash_pnext_struct(recorder, h, *static_cast<const VkSamplerYcbcrConversionCreateInfo *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_LIBRARY_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkGraphicsPipelineLibraryCreateInfoEXT *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_LIBRARY_CREATE_INFO_KHR:
			if (!hash_pnext_struct(recorder, h, *static_cast<const VkPipelineLibraryCreateInfoKHR *>(pNext)))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLIP_CONTROL_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineViewportDepthClipControlCreateInfoEXT *>(pNext), dynamic_state_info);
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO_KHR:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineCreateFlags2CreateInfoKHR *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_RENDER_PASS_CREATION_CONTROL_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkRenderPassCreationControlEXT *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_SAMPLER_BORDER_COLOR_COMPONENT_MAPPING_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkSamplerBorderColorComponentMappingCreateInfoEXT *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_MULTISAMPLED_RENDER_TO_SINGLE_SAMPLED_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkMultisampledRenderToSingleSampledInfoEXT *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_DEPTH_BIAS_REPRESENTATION_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkDepthBiasRepresentationInfoEXT *>(pNext), dynamic_state_info);
			break;

		case VK_STRUCTURE_TYPE_RENDER_PASS_FRAGMENT_DENSITY_MAP_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkRenderPassFragmentDensityMapCreateInfoEXT *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_SAMPLE_LOCATIONS_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkSampleLocationsInfoEXT *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_ROBUSTNESS_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineRobustnessCreateInfoEXT *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLAMP_CONTROL_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineViewportDepthClampControlCreateInfoEXT *>(pNext), dynamic_state_info);
			break;

		case VK_STRUCTURE_TYPE_RENDERING_ATTACHMENT_LOCATION_INFO_KHR:
			hash_pnext_struct(recorder, h, *static_cast<const VkRenderingAttachmentLocationInfoKHR *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_RENDERING_INPUT_ATTACHMENT_INDEX_INFO_KHR:
			hash_pnext_struct(recorder, h, *static_cast<const VkRenderingInputAttachmentIndexInfoKHR *>(pNext));
			break;

		default:
			log_error_pnext_chain("Unsupported pNext found, cannot hash.", pNext);
			return false;
		}

		pNext = pin->pNext;
	}

	return true;
}